

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O2

_Bool sk_address_is_local(SockAddr *addr)

{
  _Bool _Var1;
  
  if (addr->superfamily == UNRESOLVED) {
    return false;
  }
  if (addr->superfamily == UNIX) {
    return true;
  }
  _Var1 = sockaddr_is_loopback(addr->ais->ai_addr);
  return _Var1;
}

Assistant:

bool sk_address_is_local(SockAddr *addr)
{
    if (addr->superfamily == UNRESOLVED)
        return false;                  /* we don't know; assume not */
    else if (addr->superfamily == UNIX)
        return true;
    else {
#ifndef NO_IPV6
        return sockaddr_is_loopback(addr->ais->ai_addr);
#else
        struct in_addr a;
        SockAddrStep step;
        START_STEP(addr, step);
        assert(SOCKADDR_FAMILY(addr, step) == AF_INET);
        a.s_addr = htonl(addr->addresses[0]);
        return ipv4_is_loopback(a);
#endif
    }
}